

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O1

int Aig_ManCutCount(Aig_ManCut_t *p,int *pnCutsK)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  Aig_Cut_t *pAVar8;
  
  pVVar1 = p->pAig->vObjs;
  lVar5 = (long)pVVar1->nSize;
  if (lVar5 < 1) {
    iVar3 = 0;
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    iVar4 = 0;
    iVar3 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar6];
      if (((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) &&
         (iVar7 = p->nCutsMax, 0 < iVar7)) {
        pAVar8 = p->pCuts[*(int *)((long)pvVar2 + 0x24)];
        do {
          if (pAVar8->nFanins != '\0') {
            iVar3 = iVar3 + 1;
            iVar4 = iVar4 + (uint)(p->nLeafMax == (int)pAVar8->nFanins);
          }
          pAVar8 = (Aig_Cut_t *)((long)&pAVar8->pNext + (long)pAVar8->nCutSize);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  if (pnCutsK != (int *)0x0) {
    *pnCutsK = iVar4;
  }
  return iVar3;
}

Assistant:

int Aig_ManCutCount( Aig_ManCut_t * p, int * pnCutsK )
{
    Aig_Cut_t * pCut;
    Aig_Obj_t * pObj;
    int i, k, nCuts = 0, nCutsK = 0;
    Aig_ManForEachNode( p->pAig, pObj, i )
        Aig_ObjForEachCut( p, pObj, pCut, k )
        {
            if ( pCut->nFanins == 0 )
                continue;
            nCuts++;
            if ( pCut->nFanins == p->nLeafMax )
                nCutsK++;
        }
    if ( pnCutsK )
        *pnCutsK = nCutsK;
    return nCuts;
}